

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O0

void calcBias<Blob<224>,Blob<128>>
               (pfHash hash,vector<int,_std::allocator<int>_> *counts,int reps,Rand *r,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  code *in_RDI;
  byte in_R8B;
  int bitB;
  int bitA;
  int iOut;
  int iBit;
  int *cursor;
  int irep;
  Blob<128> B;
  Blob<128> A;
  Blob<224> K;
  int hashbits;
  int keybits;
  int hashbytes;
  int keybytes;
  uint32_t local_88;
  uint32_t local_84;
  int *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int iVar3;
  Rand *in_stack_ffffffffffffff90;
  Blob<128> local_60;
  Blob<224> local_50;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  byte local_21;
  int local_14;
  vector<int,_std::allocator<int>_> *local_10;
  code *local_8;
  
  local_21 = in_R8B & 1;
  local_28 = 0x1c;
  local_2c = 0x10;
  local_30 = 0xe0;
  local_34 = 0x80;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Blob<224>::Blob(&local_50);
  Blob<128>::Blob(&local_60);
  Blob<128>::Blob((Blob<128> *)&stack0xffffffffffffff90);
  for (iVar3 = 0; iVar3 < local_14; iVar3 = iVar3 + 1) {
    if (((local_21 & 1) != 0) && (iVar3 % (local_14 / 10) == 0)) {
      printf(".");
    }
    Rand::rand_p(in_stack_ffffffffffffff90,(void *)CONCAT44(iVar3,in_stack_ffffffffffffff88),
                 (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    (*local_8)(&local_50,0x1c,0,&local_60);
    in_stack_ffffffffffffff80 = std::vector<int,_std::allocator<int>_>::operator[](local_10,0);
    for (local_84 = 0; (int)local_84 < 0xe0; local_84 = local_84 + 1) {
      flipbit(&local_50,0x1c,local_84);
      (*local_8)(&local_50,0x1c,0,&stack0xffffffffffffff90);
      flipbit(&local_50,0x1c,local_84);
      for (local_88 = 0; (int)local_88 < 0x80; local_88 = local_88 + 1) {
        uVar1 = getbit(&local_60,0x10,local_88);
        uVar2 = getbit(&stack0xffffffffffffff90,0x10,local_88);
        *in_stack_ffffffffffffff80 = (uVar1 ^ uVar2) + *in_stack_ffffffffffffff80;
        in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 + 1;
      }
    }
  }
  return;
}

Assistant:

void calcBias ( pfHash hash, std::vector<int> & counts, int reps, Rand & r, bool verbose )
{
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  keytype K;
  hashtype A,B;

  for(int irep = 0; irep < reps; irep++)
  {
    if(verbose) {
      if(irep % (reps/10) == 0) printf(".");
    }

    r.rand_p(&K,keybytes);

    hash(&K,keybytes,0,&A);

    int * cursor = &counts[0];

    for(int iBit = 0; iBit < keybits; iBit++)
    {
      flipbit(&K,keybytes,iBit);
      hash(&K,keybytes,0,&B);
      flipbit(&K,keybytes,iBit);

      for(int iOut = 0; iOut < hashbits; iOut++)
      {
        int bitA = getbit(&A,hashbytes,iOut);
        int bitB = getbit(&B,hashbytes,iOut);

        (*cursor++) += (bitA ^ bitB);
      }
    }
  }
}